

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryPushJavascriptArray
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  int operationSucceeded;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  uint local_44;
  undefined1 local_40 [4];
  uint index;
  ThrowTypeErrorOnFailureHelper h;
  uint n;
  uint argCount_local;
  Var *args_local;
  JavascriptArray *arr_local;
  ScriptContext *scriptContext_local;
  
  h.m_functionName._4_4_ = argCount;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arr);
  h.m_functionName._0_4_ = (arr->super_ArrayObject).length;
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)local_40,scriptContext,L"Array.prototype.push");
  if ((h.m_functionName._4_4_ == 1) && ((Type)h.m_functionName != 0xffffffff)) {
    operationSucceeded =
         (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                   (arr,(ulong)(Type)h.m_functionName,*args,0);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_40,operationSucceeded);
    scriptContext_local =
         (ScriptContext *)JavascriptNumber::ToVar((Type)h.m_functionName + 1,scriptContext);
  }
  else if ((h.m_functionName._4_4_ < -(Type)h.m_functionName - 1) &&
          ((bVar2 = IsVarArray(arr), bVar2 &&
           (pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)arr),
           scriptContext == pSVar3)))) {
    for (local_44 = 0; local_44 < h.m_functionName._4_4_; local_44 = local_44 + 1) {
      if ((Type)h.m_functionName == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x152f,"(n != JavascriptArray::MaxArrayLength)",
                                    "n != JavascriptArray::MaxArrayLength");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      DirectSetItemAt<void*>(arr,(Type)h.m_functionName,args[local_44]);
      h.m_functionName._0_4_ = (Type)h.m_functionName + 1;
    }
    scriptContext_local =
         (ScriptContext *)JavascriptNumber::ToVar((Type)h.m_functionName,scriptContext);
  }
  else {
    scriptContext_local =
         (ScriptContext *)
         EntryPushJavascriptArrayNoFastPath(scriptContext,arr,args,h.m_functionName._4_4_);
  }
  return scriptContext_local;
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArray(ScriptContext * scriptContext, JavascriptArray * arr, Var * args, uint argCount)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arr);
#endif

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // Fast Path for one push for small indexes
        if (argCount == 1 && n < JavascriptArray::MaxArrayLength)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[0], PropertyOperation_None));
            return JavascriptNumber::ToVar(n + 1, scriptContext);
        }

        // Fast Path for multiple push for small indexes
        if (argCount < JavascriptArray::MaxArrayLength - n && JavascriptArray::IsVarArray(arr) && scriptContext == arr->GetScriptContext())
        {
            uint index;
            for (index = 0; index < argCount; ++index, ++n)
            {
                Assert(n != JavascriptArray::MaxArrayLength);
                // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
                arr->JavascriptArray::DirectSetItemAt(n, args[index]);
            }
            return JavascriptNumber::ToVar(n, scriptContext);
        }

        return EntryPushJavascriptArrayNoFastPath(scriptContext, arr, args, argCount);
    }